

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varchar_data.hpp
# Opt level: O0

void duckdb::ArrowVarcharData<duckdb::string_t,_duckdb::ArrowVarcharConverter,_long>::Finalize
               (ArrowAppendData *append_data,LogicalType *type,ArrowArray *result)

{
  ArrowBuffer *pAVar1;
  data_ptr_t pdVar2;
  long in_RDX;
  
  *(undefined8 *)(in_RDX + 0x18) = 3;
  pAVar1 = ArrowAppendData::GetMainBuffer((ArrowAppendData *)0x1537e88);
  pdVar2 = ArrowBuffer::data(pAVar1);
  *(data_ptr_t *)(*(long *)(in_RDX + 0x28) + 8) = pdVar2;
  pAVar1 = ArrowAppendData::GetAuxBuffer((ArrowAppendData *)0x1537ea9);
  pdVar2 = ArrowBuffer::data(pAVar1);
  *(data_ptr_t *)(*(long *)(in_RDX + 0x28) + 0x10) = pdVar2;
  return;
}

Assistant:

static void Finalize(ArrowAppendData &append_data, const LogicalType &type, ArrowArray *result) {
		result->n_buffers = 3;
		result->buffers[1] = append_data.GetMainBuffer().data();
		result->buffers[2] = append_data.GetAuxBuffer().data();
	}